

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O3

int file_is_compressed(char *filename)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  uchar buffer [2];
  FILE *diskfile;
  char tmpfilename [1025];
  short local_432;
  FILE *local_430;
  char local_428 [1040];
  
  uVar3 = 0;
  iVar1 = file_openfile(filename,0,(FILE **)&local_430);
  if (iVar1 != 0) {
    sVar2 = strlen(filename);
    if (0x3fc < sVar2) {
      return 0;
    }
    strcpy(local_428,filename);
    sVar2 = strlen(filename);
    builtin_strncpy(filename + sVar2,".gz",4);
    iVar1 = file_openfile(filename,0,(FILE **)&local_430);
    if (iVar1 != 0) {
      strcpy(filename,local_428);
      sVar2 = strlen(filename);
      (filename + sVar2)[0] = '.';
      (filename + sVar2)[1] = 'Z';
      filename[sVar2 + 2] = '\0';
      iVar1 = file_openfile(filename,0,(FILE **)&local_430);
      if (iVar1 != 0) {
        strcpy(filename,local_428);
        sVar2 = strlen(filename);
        (filename + sVar2)[0] = '.';
        (filename + sVar2)[1] = 'z';
        filename[sVar2 + 2] = '\0';
        iVar1 = file_openfile(filename,0,(FILE **)&local_430);
        if (iVar1 != 0) {
          strcpy(filename,local_428);
          sVar2 = strlen(filename);
          builtin_strncpy(filename + sVar2,".zip",5);
          iVar1 = file_openfile(filename,0,(FILE **)&local_430);
          if (iVar1 != 0) {
            strcpy(filename,local_428);
            sVar2 = strlen(filename);
            (filename + sVar2)[0] = '-';
            (filename + sVar2)[1] = 'z';
            filename[sVar2 + 2] = '\0';
            iVar1 = file_openfile(filename,0,(FILE **)&local_430);
            if (iVar1 != 0) {
              strcpy(filename,local_428);
              sVar2 = strlen(filename);
              builtin_strncpy(filename + sVar2,"-gz",4);
              iVar1 = file_openfile(filename,0,(FILE **)&local_430);
              if (iVar1 != 0) {
                strcpy(filename,local_428);
                return 0;
              }
            }
          }
        }
      }
    }
  }
  sVar2 = fread(&local_432,1,2,local_430);
  fclose(local_430);
  if ((((sVar2 == 2) && (uVar3 = 1, local_432 != -0x74e1)) && (local_432 != 0x4b50)) &&
     ((local_432 != 0x1e1f && (local_432 != -0x62e1)))) {
    uVar3 = (uint)(local_432 == -0x5fe1);
  }
  return uVar3;
}

Assistant:

int file_is_compressed(char *filename) /* I - FITS file name          */
/*
  Test if the disk file is compressed.  Returns 1 if compressed, 0 if not.
  This may modify the filename string by appending a compression suffex.
*/
{
    FILE *diskfile;
    unsigned char buffer[2];
    char tmpfilename[FLEN_FILENAME];

    /* Open file.  Try various suffix combinations */  
    if (file_openfile(filename, 0, &diskfile))
    {
      if (strlen(filename) > FLEN_FILENAME - 5)
          return(0);

      strcpy(tmpfilename,filename);
      strcat(filename,".gz");
      if (file_openfile(filename, 0, &diskfile))
      {
#if HAVE_BZIP2
        strcpy(filename,tmpfilename);
        strcat(filename,".bz2");
        if (file_openfile(filename, 0, &diskfile))
        {
#endif
        strcpy(filename, tmpfilename);
        strcat(filename,".Z");
        if (file_openfile(filename, 0, &diskfile))
        {
          strcpy(filename, tmpfilename);
          strcat(filename,".z");   /* it's often lower case on CDROMs */
          if (file_openfile(filename, 0, &diskfile))
          {
            strcpy(filename, tmpfilename);
            strcat(filename,".zip");
            if (file_openfile(filename, 0, &diskfile))
            {
              strcpy(filename, tmpfilename);
              strcat(filename,"-z");      /* VMS suffix */
              if (file_openfile(filename, 0, &diskfile))
              {
                strcpy(filename, tmpfilename);
                strcat(filename,"-gz");    /* VMS suffix */
                if (file_openfile(filename, 0, &diskfile))
                {
                  strcpy(filename,tmpfilename);  /* restore original name */
                  return(0);    /* file not found */
                }
              }
            }
          }
        }
#if HAVE_BZIP2
        }
#endif
      }
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);   /* error reading file so just return */
        return(0);
    }

    fclose(diskfile);

       /* see if the 2 bytes have the magic values for a compressed file */
    if ( (memcmp(buffer, "\037\213", 2) == 0) ||  /* GZIP  */
         (memcmp(buffer, "\120\113", 2) == 0) ||  /* PKZIP */
         (memcmp(buffer, "\037\036", 2) == 0) ||  /* PACK  */
         (memcmp(buffer, "\037\235", 2) == 0) ||  /* LZW   */
#if HAVE_BZIP2
         (memcmp(buffer, "BZ",       2) == 0) ||  /* BZip2 */
#endif
         (memcmp(buffer, "\037\240", 2) == 0))  /* LZH   */
        {
            return(1);  /* this is a compressed file */
        }
    else
        {
            return(0);  /* not a compressed file */
        }
}